

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
::swap(btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
       *this,btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
             *x,allocator_type *alloc)

{
  template_ElementType<1UL> tVar1;
  btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
  *this_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  template_ElementType<2UL> *this_01;
  template_ElementType<2UL> *__p;
  template_ElementType<3UL> *ppbVar8;
  template_ElementType<3UL> *ppbVar9;
  template_ElementType<3UL> *__first2;
  template_ElementType<0UL> *ppbVar10;
  template_ElementType<1UL> *ptVar11;
  template_ElementType<1UL> *ptVar12;
  long lVar13;
  btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *this_02;
  ulong uVar14;
  
  bVar2 = leaf(this);
  bVar3 = leaf(x);
  if (bVar2 != bVar3) {
    __assert_fail("leaf() == x->leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x942,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>]"
                 );
  }
  bVar4 = count(this);
  bVar5 = count(x);
  this_02 = x;
  this_00 = (btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
             *)this;
  if (bVar5 < bVar4) {
    this_02 = this;
    this_00 = (btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
               *)x;
  }
  this_01 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
            ::GetField<2ul>(this_00);
  __p = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
        ::GetField<2ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                         *)this_02);
  bVar4 = count((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 *)this_00);
  for (lVar13 = (ulong)bVar4 * 0x28; lVar13 != 0; lVar13 = lVar13 + -0x28) {
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::swap((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&this_01->value,
           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&__p->value);
    this_01 = this_01 + 1;
    __p = __p + 1;
  }
  bVar4 = count(this_02);
  bVar5 = count((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 *)this_00);
  bVar6 = count((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 *)this_00);
  bVar7 = count((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 *)this_00);
  uninitialized_move_n
            (this_02,(ulong)bVar4 - (ulong)bVar5,(ulong)bVar6,(ulong)bVar7,
             (btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              *)this_00,alloc);
  bVar6 = count((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                 *)this_00);
  value_destroy_n(this_02,(ulong)bVar6,(ulong)bVar4 - (ulong)bVar5,alloc);
  bVar2 = leaf(this);
  if (!bVar2) {
    ppbVar8 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
              ::GetField<3ul>(this_00);
    bVar4 = count((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                   *)this_00);
    ppbVar9 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
              ::GetField<3ul>(this_00);
    __first2 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
               ::GetField<3ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                                *)this_02);
    std::
    swap_ranges<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>**,phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>**>
              (ppbVar8,ppbVar9 + (ulong)bVar4 + 1,__first2);
    for (uVar14 = 0;
        bVar4 = count((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                       *)this_00), uVar14 <= bVar4; uVar14 = uVar14 + 1) {
      ppbVar8 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                ::GetField<3ul>(this_00);
      ppbVar10 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                 ::GetField<0ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                                  *)ppbVar8[uVar14]);
      *ppbVar10 = (template_ElementType<0UL>)this_00;
      ppbVar8 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                ::GetField<3ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                                 *)this_02);
      ppbVar10 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                 ::GetField<0ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                                  *)ppbVar8[uVar14]);
      *ppbVar10 = this_02;
    }
    for (; bVar4 = count(this_02), uVar14 <= bVar4; uVar14 = uVar14 + 1) {
      ppbVar8 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                ::GetField<3ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                                 *)this_02);
      init_child((btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                  *)this_00,(int)uVar14,ppbVar8[uVar14]);
      btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
      ::GetField<3ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                       *)this_02);
    }
  }
  ptVar11 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                             *)this);
  ptVar12 = btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                             *)x);
  tVar1 = ptVar11[2];
  ptVar11[2] = ptVar12[2];
  ptVar12[2] = tVar1;
  return;
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
        using std::swap;
        assert(leaf() == x->leaf());

        // Determine which is the smaller/larger node.
        btree_node *smaller = this, *larger = x;
        if (smaller->count() > larger->count()) {
            swap(smaller, larger);
        }

        // Swap the values.
        for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
             a != end; ++a, ++b) {
            params_type::swap(alloc, a, b);
        }

        // Move values that can't be swapped.
        const size_type to_move = larger->count() - smaller->count();
        larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                                     smaller, alloc);
        larger->value_destroy_n(smaller->count(), to_move, alloc);

        if (!leaf()) {
            // Swap the child pointers.
            std::swap_ranges(&smaller->mutable_child(0),
                             &smaller->mutable_child(smaller->count() + 1),
                             &larger->mutable_child(0));
            // Update swapped children's parent pointers.
            int i = 0;
            for (; i <= smaller->count(); ++i) {
                smaller->child(i)->set_parent(smaller);
                larger->child(i)->set_parent(larger);
            }
            // Move the child pointers that couldn't be swapped.
            for (; i <= larger->count(); ++i) {
                smaller->init_child(i, larger->child(i));
                larger->clear_child(i);
            }
        }

        // Swap the counts.
        swap(mutable_count(), x->mutable_count());
    }